

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,char *error)

{
  TokenType TVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  uint64 local_30;
  uint64 value;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_30 = 0;
    bVar3 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,0x7fffffff,&local_30);
    if (!bVar3) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Integer out of range.","")
      ;
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,local_50);
      }
      this->had_errors_ = true;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    *output = (int)local_30;
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)local_50,error,(allocator *)&local_30);
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_50);
    }
    this->had_errors_ = true;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger(int* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text, kint32max,
                                     &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}